

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_interpreted.hpp
# Opt level: O1

void * __thiscall
randomx::InterpretedVm<randomx::AlignedAllocator<64ul>,true>::operator_new
          (InterpretedVm<randomx::AlignedAllocator<64ul>,true> *this,size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = AlignedAllocator<64UL>::allocMemory((size_t)this);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = ::operator_delete;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* operator new(size_t size) {
			void* ptr = AlignedAllocator<CacheLineSize>::allocMemory(size);
			if (ptr == nullptr)
				throw std::bad_alloc();
			return ptr;
		}